

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O0

void __thiscall
ScriptMemoryDumper::FillObjectWithStats
          (ScriptMemoryDumper *this,DynamicObject *dynamicObject,HeapStats stats)

{
  uint uVar1;
  Var pvVar2;
  DynamicObject *dynamicObject_local;
  ScriptMemoryDumper *this_local;
  
  uVar1 = this->pageCountId;
  pvVar2 = Js::JavascriptTypedNumber<unsigned_long>::ToVar(stats.pageCount,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar2);
  uVar1 = this->objectSizeId;
  pvVar2 = Js::JavascriptNumber::New((double)stats.objectSize,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar2,0,0);
  uVar1 = this->freeObjectCountId;
  pvVar2 = Js::JavascriptNumber::New((double)stats.freeObjectCount,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar2,0,0);
  uVar1 = this->activeObjectCountId;
  pvVar2 = Js::JavascriptNumber::New((double)stats.activeObjectCount,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar2,0,0);
  uVar1 = this->activeObjectByteSizeId;
  pvVar2 = Js::JavascriptTypedNumber<unsigned_long>::ToVar
                     (stats.activeObjectByteSize,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar2,0,0);
  uVar1 = this->totalByteCountId;
  pvVar2 = Js::JavascriptTypedNumber<unsigned_long>::ToVar(stats.totalByteCount,this->scriptContext)
  ;
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar2,0,0);
  uVar1 = this->finalizeCountId;
  pvVar2 = Js::JavascriptNumber::New((double)stats.finalizeCount,this->scriptContext);
  (*(dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(dynamicObject,(ulong)uVar1,pvVar2,0,0);
  return;
}

Assistant:

void ScriptMemoryDumper::FillObjectWithStats(Js::DynamicObject* dynamicObject, HeapStats stats)
{
    dynamicObject->SetProperty(pageCountId, Js::JavascriptUInt64Number::ToVar(stats.pageCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(objectSizeId, Js::JavascriptNumber::New(stats.objectSize, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(freeObjectCountId, Js::JavascriptNumber::New(stats.freeObjectCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(activeObjectCountId, Js::JavascriptNumber::New(stats.activeObjectCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(activeObjectByteSizeId, Js::JavascriptUInt64Number::ToVar(stats.activeObjectByteSize, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(totalByteCountId, Js::JavascriptUInt64Number::ToVar(stats.totalByteCount, scriptContext),  Js::PropertyOperation_None, NULL);
    dynamicObject->SetProperty(finalizeCountId, Js::JavascriptNumber::New(stats.finalizeCount, scriptContext),  Js::PropertyOperation_None, NULL);
}